

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
          (CodedInputStream *this,Limit limit)

{
  int v1;
  int v2;
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  LogMessageFatal local_38 [23];
  Voidify local_21;
  string *local_20;
  string *absl_log_internal_check_op_result;
  bool result;
  CodedInputStream *pCStack_10;
  Limit limit_local;
  CodedInputStream *this_local;
  
  absl_log_internal_check_op_result._4_4_ = limit;
  pCStack_10 = this;
  absl_log_internal_check_op_result._3_1_ = ConsumedEntireMessage(this);
  PopLimit(this,absl_log_internal_check_op_result._4_4_);
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue(this->recursion_budget_);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue(this->recursion_limit_);
  local_20 = absl::lts_20240722::log_internal::Check_LTImpl_abi_cxx11_
                       (v1,v2,"recursion_budget_ < recursion_limit_");
  if (local_20 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/io/coded_stream.cc"
               ,0x9e,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_38);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_21,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
  }
  this->recursion_budget_ = this->recursion_budget_ + 1;
  return (bool)(absl_log_internal_check_op_result._3_1_ & 1);
}

Assistant:

bool CodedInputStream::DecrementRecursionDepthAndPopLimit(Limit limit) {
  bool result = ConsumedEntireMessage();
  PopLimit(limit);
  ABSL_DCHECK_LT(recursion_budget_, recursion_limit_);
  ++recursion_budget_;
  return result;
}